

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  long lVar3;
  ImGuiSettingsHandler *pIVar4;
  
  pIVar1 = GImGui;
  IVar2 = ImHashStr(type_name,0,0);
  lVar3 = (long)(pIVar1->SettingsHandlers).Size;
  if (0 < lVar3) {
    pIVar4 = (pIVar1->SettingsHandlers).Data;
    do {
      if (pIVar4->TypeHash == IVar2) {
        return pIVar4;
      }
      pIVar4 = pIVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (ImGuiSettingsHandler *)0x0;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}